

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O1

void __thiscall Assimp::BlobIOStream::~BlobIOStream(BlobIOStream *this)

{
  pointer pcVar1;
  
  (this->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__BlobIOStream_0081ce98;
  BlobIOSystem::OnDestruct(this->creator,&this->file,this);
  if (this->buffer != (uint8_t *)0x0) {
    operator_delete__(this->buffer);
  }
  pcVar1 = (this->file)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->file).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

BlobIOStream :: ~BlobIOStream()
{
    creator->OnDestruct(file,this);
    delete[] buffer;
}